

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall
Lib::
Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::DerefTask>
::expand(Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::InstMatcher::DerefTask>
         *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  DerefTask *__ptr;
  undefined8 uVar3;
  DerefTask *pDVar4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  bool bVar8;
  
  sVar7 = 8;
  if (this->_capacity != 0) {
    sVar7 = this->_capacity * 2;
  }
  pDVar4 = (DerefTask *)Lib::alloc(sVar7 * 0x18);
  sVar6 = this->_capacity;
  if (sVar6 == 0) {
    sVar6 = 0;
  }
  else {
    __ptr = this->_stack;
    lVar5 = 0;
    while (bVar8 = sVar6 != 0, sVar6 = sVar6 - 1, bVar8) {
      *(undefined8 *)((long)&(pDVar4->trm).t._content + lVar5) =
           *(undefined8 *)((long)&(__ptr->trm).t._content + lVar5);
      puVar1 = (undefined8 *)((long)&(__ptr->var)._content + lVar5);
      uVar3 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(pDVar4->var)._content + lVar5);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
      lVar5 = lVar5 + 0x18;
    }
    Lib::free(__ptr);
    sVar6 = this->_capacity;
  }
  this->_stack = pDVar4;
  this->_cursor = pDVar4 + sVar6;
  this->_end = pDVar4 + sVar7;
  this->_capacity = sVar7;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }